

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf.h
# Opt level: O1

uint gf_mul(uint a,uint b)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = 0;
  if (b != 0 && a != 0) {
    uVar2 = index_of[b] + index_of[a];
    uVar1 = (index_of[b] - 0xff) + index_of[a];
    if (uVar2 < 0xff) {
      uVar1 = uVar2;
    }
    uVar2 = alpha_of[uVar1];
  }
  return uVar2;
}

Assistant:

uint32_t gf_mul(uint32_t a, uint32_t b)
{
    uint32_t sum;
    if (a == 0 || b == 0)
        return 0;
    if (a < 0 || b < 0)
        return -1;
    sum = index_of[a] + index_of[b]; // вычисляем сумму индексов полиномов
    if (sum >= GFsize - 1)
        sum -= GFsize - 1; // приводим сумму к модулю GF
    return alpha_of[sum];  // переводим результат в полиномиальную...
                           // ...форму и возвращаем результат
}